

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O1

int32_t __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::internalPrev
          (SimpleFilteredSentenceBreakIterator *this,int32_t n)

{
  int n_00;
  uint in_EAX;
  EFBMatchResult EVar1;
  uint uVar2;
  UErrorCode *pUVar3;
  UErrorCode *pUVar4;
  UErrorCode *pUVar5;
  UErrorCode status;
  undefined8 uStack_28;
  
  pUVar4 = (UErrorCode *)(ulong)(uint)n;
  if ((1 < n + 1U) &&
     ((this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr !=
      (UCharsTrie *)0x0)) {
    uStack_28 = (ulong)in_EAX;
    resetState(this,(UErrorCode *)((long)&uStack_28 + 4));
    n = -1;
    pUVar5 = (UErrorCode *)((long)&uStack_28 + 4);
    if (uStack_28._4_4_ < 1) {
      do {
        pUVar3 = pUVar4;
        n_00 = (int)pUVar3;
        if (0xfffffffd < n_00 - 1U) {
          return n_00;
        }
        EVar1 = breakExceptionAt(this,n_00);
        pUVar4 = pUVar3;
        if (EVar1 != kNoExceptionHere) {
          uVar2 = (*(((this->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>.ptr)->
                    super_UObject)._vptr_UObject[0xc])();
          pUVar4 = (UErrorCode *)(ulong)uVar2;
          pUVar3 = (UErrorCode *)((ulong)pUVar5 & 0xffffffff);
        }
        n = (int32_t)pUVar3;
        pUVar5 = pUVar3;
      } while (EVar1 != kNoExceptionHere);
    }
  }
  return n;
}

Assistant:

int32_t
SimpleFilteredSentenceBreakIterator::internalPrev(int32_t n) {
  if(n == 0 || n == UBRK_DONE || // at end  or
    fData->fBackwardsTrie.isNull()) { // .. no backwards table loaded == no exceptions
      return n;
  }
  // OK, do we need to break here?
  UErrorCode status = U_ZERO_ERROR;
  // refresh text
  resetState(status);
  if(U_FAILURE(status)) return UBRK_DONE; // bail out

  //if(debug2) u_printf("str, native len=%d\n", utext_nativeLength(fText.getAlias()));
  while (n != UBRK_DONE && n != 0) { // outer loop runs once per underlying break (from fDelegate).
    SimpleFilteredSentenceBreakIterator::EFBMatchResult m = breakExceptionAt(n);

    switch(m) {
    case kExceptionHere:
      n = fDelegate->previous(); // skip this one. Find the next lowerlevel break.
      continue;

    default:
    case kNoExceptionHere:
      return n;
    }    
  }
  return n;
}